

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  parasail_result_t *ppVar10;
  __m128i *b;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *ptr_00;
  __m128i *ptr_01;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  __m128i *palVar14;
  long lVar15;
  char *pcVar16;
  undefined8 extraout_RDX;
  size_t sVar17;
  uint uVar18;
  ulong uVar19;
  char *__format;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  size_t __n;
  bool bVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar32;
  ulong uVar27;
  int iVar31;
  int iVar34;
  int iVar36;
  undefined1 auVar28 [16];
  int iVar35;
  int iVar37;
  undefined1 auVar29 [16];
  uint uVar33;
  undefined1 auVar30 [16];
  int iVar38;
  uint uVar39;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  uint uVar50;
  int iVar51;
  uint uVar52;
  int iVar53;
  uint uVar54;
  int iVar55;
  uint uVar56;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  undefined1 auVar57 [16];
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  __m128i c;
  __m128i c_00;
  uint local_150;
  int local_14c;
  long local_148;
  size_t len;
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar16 = "profile";
  }
  else {
    pvVar3 = (profile->profile32).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar16 = "profile->profile32.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar16 = "profile->matrix";
      }
      else {
        uVar20 = (ulong)(uint)profile->s1Len;
        if (profile->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar16 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar16 = "open";
        }
        else {
          if (-1 < gap) {
            iVar24 = ppVar4->min;
            uVar22 = 0x80000000 - iVar24;
            if (iVar24 != -open && SBORROW4(iVar24,-open) == iVar24 + open < 0) {
              uVar22 = open | 0x80000000;
            }
            uVar9 = 0x7ffffffe - ppVar4->max;
            ppVar10 = parasail_result_new_table1((uint)(uVar20 + 3) & 0x7ffffffc,s2Len);
            if (ppVar10 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar19 = uVar20 + 3 >> 2;
            ppVar10->flag = ppVar10->flag | 0x4420404;
            b = parasail_memalign___m128i(0x10,uVar19);
            ptr = parasail_memalign___m128i(0x10,uVar19);
            b_00 = parasail_memalign___m128i(0x10,uVar19);
            ptr_00 = parasail_memalign___m128i(0x10,uVar19);
            ptr_01 = parasail_memalign___m128i(0x10,uVar19);
            c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
            c[1]._0_1_ = (ptr_00 == (__m128i *)0x0 || b_00 == (__m128i *)0x0) ||
                         (ptr == (__m128i *)0x0 || b == (__m128i *)0x0);
            if (ptr_01 == (__m128i *)0x0 ||
                ((ptr_00 == (__m128i *)0x0 || b_00 == (__m128i *)0x0) ||
                (ptr == (__m128i *)0x0 || b == (__m128i *)0x0))) {
              return (parasail_result_t *)0x0;
            }
            uVar22 = uVar22 + 1;
            uVar18 = (uint)uVar19;
            uVar12 = -(gap * uVar18);
            len = (size_t)uVar12;
            c[0] = uVar19;
            parasail_memset___m128i(b_00,c,len);
            c_00[1] = extraout_RDX_00;
            c_00[0] = uVar19;
            parasail_memset___m128i(b,c_00,len);
            iVar24 = -open;
            iVar31 = -open;
            iVar34 = -open;
            iVar36 = -open;
            for (uVar13 = uVar18 - 1; -1 < (int)uVar13; uVar13 = uVar13 - 1) {
              palVar14 = ptr_01 + uVar13;
              *(int *)*palVar14 = iVar24;
              *(int *)((long)*palVar14 + 4) = iVar31;
              *(int *)(*palVar14 + 1) = iVar34;
              *(int *)((long)*palVar14 + 0xc) = iVar36;
              iVar24 = iVar24 - gap;
              iVar31 = iVar31 - gap;
              iVar34 = iVar34 - gap;
              iVar36 = iVar36 - gap;
            }
            palVar14 = b_00 + (uVar18 - 1);
            uVar11 = (ulong)(uint)s2Len;
            __n = uVar19 << 4;
            lVar21 = uVar19 * uVar11;
            local_148 = 0;
            local_14c = 0;
            uVar13 = uVar22;
            uVar58 = uVar22;
            uVar59 = uVar22;
            uVar60 = uVar22;
            uVar26 = uVar22;
            uVar33 = uVar22;
            uVar69 = uVar22;
            uVar70 = uVar22;
            uVar65 = uVar22;
            uVar66 = uVar22;
            uVar67 = uVar22;
            uVar68 = uVar22;
            uVar61 = uVar9;
            uVar62 = uVar9;
            uVar63 = uVar9;
            uVar64 = uVar9;
            local_150 = uVar22;
            for (uVar19 = 0; uVar19 != uVar11; uVar19 = uVar19 + 1) {
              iVar24 = ppVar4->mapper[(byte)s2[uVar19]];
              auVar28 = (undefined1  [16])0x0;
              sVar17 = 0;
              iVar31 = 0;
              iVar34 = (int)(*palVar14)[0];
              iVar36 = *(int *)((long)*palVar14 + 4);
              iVar38 = (int)(*palVar14)[1];
              uVar39 = uVar22;
              uVar42 = uVar22;
              uVar43 = uVar22;
              uVar44 = uVar22;
              while( true ) {
                iVar25 = auVar28._0_4_;
                iVar32 = auVar28._4_4_;
                iVar35 = auVar28._8_4_;
                if (__n == sVar17) break;
                piVar1 = (int *)((long)*b_00 + sVar17);
                iVar5 = *piVar1;
                iVar6 = piVar1[1];
                iVar7 = piVar1[2];
                iVar8 = piVar1[3];
                piVar1 = (int *)((long)*b + sVar17);
                iVar45 = *piVar1 - gap;
                iVar46 = piVar1[1] - gap;
                iVar47 = piVar1[2] - gap;
                iVar48 = piVar1[3] - gap;
                iVar49 = iVar5 - open;
                iVar51 = iVar6 - open;
                iVar53 = iVar7 - open;
                iVar55 = iVar8 - open;
                piVar1 = (int *)((long)pvVar3 + sVar17 + (long)(int)(iVar24 * uVar18) * 0x10);
                iVar31 = iVar31 + *piVar1;
                iVar34 = iVar34 + piVar1[1];
                iVar36 = iVar36 + piVar1[2];
                iVar38 = iVar38 + piVar1[3];
                piVar1 = (int *)((long)*ptr_01 + sVar17);
                iVar25 = iVar25 + *piVar1;
                iVar32 = iVar32 + piVar1[1];
                iVar35 = iVar35 + piVar1[2];
                iVar37 = auVar28._12_4_ + piVar1[3];
                uVar50 = (uint)(iVar49 < iVar45) * iVar45 | (uint)(iVar49 >= iVar45) * iVar49;
                uVar52 = (uint)(iVar51 < iVar46) * iVar46 | (uint)(iVar51 >= iVar46) * iVar51;
                uVar54 = (uint)(iVar53 < iVar47) * iVar47 | (uint)(iVar53 >= iVar47) * iVar53;
                uVar56 = (uint)(iVar55 < iVar48) * iVar48 | (uint)(iVar55 >= iVar48) * iVar55;
                uVar39 = (uint)((int)uVar39 < iVar25) * iVar25 | ((int)uVar39 >= iVar25) * uVar39;
                uVar42 = (uint)((int)uVar42 < iVar32) * iVar32 | ((int)uVar42 >= iVar32) * uVar42;
                uVar43 = (uint)((int)uVar43 < iVar35) * iVar35 | ((int)uVar43 >= iVar35) * uVar43;
                uVar44 = (uint)((int)uVar44 < iVar37) * iVar37 | ((int)uVar44 >= iVar37) * uVar44;
                auVar28._0_4_ =
                     (iVar31 < (int)uVar50) * uVar50 | (uint)(iVar31 >= (int)uVar50) * iVar31;
                auVar28._4_4_ =
                     (iVar34 < (int)uVar52) * uVar52 | (uint)(iVar34 >= (int)uVar52) * iVar34;
                auVar28._8_4_ =
                     (iVar36 < (int)uVar54) * uVar54 | (uint)(iVar36 >= (int)uVar54) * iVar36;
                auVar28._12_4_ =
                     (iVar38 < (int)uVar56) * uVar56 | (uint)(iVar38 >= (int)uVar56) * iVar38;
                puVar2 = (uint *)((long)*b + sVar17);
                *puVar2 = uVar50;
                puVar2[1] = uVar52;
                puVar2[2] = uVar54;
                puVar2[3] = uVar56;
                *(undefined1 (*) [16])((long)*ptr + sVar17) = auVar28;
                sVar17 = sVar17 + 0x10;
                iVar31 = iVar5;
                iVar34 = iVar6;
                iVar36 = iVar7;
                iVar38 = iVar8;
              }
              uVar27 = auVar28._0_8_;
              iVar24 = (int)(*ptr_01)[0];
              iVar31 = *(int *)((long)*ptr_01 + 4) + iVar25;
              iVar34 = (int)(*ptr_01)[1] + iVar32;
              iVar36 = *(int *)((long)*ptr_01 + 0xc) + iVar35;
              auVar40._0_4_ =
                   (uint)((int)uVar39 < iVar24) * iVar24 | ((int)uVar39 >= iVar24) * uVar39;
              auVar40._4_4_ =
                   (uint)((int)uVar42 < iVar31) * iVar31 | ((int)uVar42 >= iVar31) * uVar42;
              auVar40._8_4_ =
                   (uint)((int)uVar43 < iVar34) * iVar34 | ((int)uVar43 >= iVar34) * uVar43;
              auVar40._12_4_ =
                   (uint)((int)uVar44 < iVar36) * iVar36 | ((int)uVar44 >= iVar36) * uVar44;
              iVar24 = 2;
              while( true ) {
                bVar23 = iVar24 == 0;
                iVar24 = iVar24 + -1;
                uVar39 = auVar40._0_4_;
                uVar42 = auVar40._4_4_;
                uVar43 = auVar40._8_4_;
                if (bVar23) break;
                iVar31 = uVar39 + uVar12;
                iVar34 = uVar42 + uVar12;
                iVar36 = uVar43 + uVar12;
                auVar41._0_4_ =
                     ((int)uVar39 < (int)uVar22) * uVar22 | ((int)uVar39 >= (int)uVar22) * uVar39;
                auVar41._4_4_ =
                     (uint)((int)uVar42 < iVar31) * iVar31 | ((int)uVar42 >= iVar31) * uVar42;
                iVar31 = auVar40._12_4_;
                auVar41._8_4_ =
                     (uint)((int)uVar43 < iVar34) * iVar34 | ((int)uVar43 >= iVar34) * uVar43;
                auVar41._12_4_ =
                     (uint)(iVar31 < iVar36) * iVar36 | (uint)(iVar31 >= iVar36) * iVar31;
                auVar40 = auVar41;
              }
              iVar25 = (uint)(-1 < (long)(uVar27 << 0x20)) * iVar25;
              iVar32 = (uint)(-1 < (long)uVar27) * iVar32;
              iVar35 = (uint)(-1 < (long)(auVar28._8_8_ << 0x20 | uVar27 >> 0x20)) * iVar35;
              iVar24 = (0 < (int)uVar22) * uVar22;
              uVar52 = (iVar25 < (int)uVar39) * uVar39 | (uint)(iVar25 >= (int)uVar39) * iVar25;
              uVar44 = (iVar32 < (int)uVar42) * uVar42 | (uint)(iVar32 >= (int)uVar42) * iVar32;
              uVar50 = (iVar35 < (int)uVar43) * uVar43 | (uint)(iVar35 >= (int)uVar43) * iVar35;
              lVar15 = local_148;
              uVar54 = uVar22;
              for (sVar17 = 0; __n != sVar17; sVar17 = sVar17 + 0x10) {
                iVar38 = uVar54 - gap;
                iVar25 = uVar39 - gap;
                iVar35 = uVar42 - gap;
                iVar32 = uVar43 - gap;
                iVar24 = iVar24 - open;
                iVar31 = uVar52 - open;
                iVar34 = uVar44 - open;
                iVar36 = uVar50 - open;
                uVar54 = (uint)(iVar38 < iVar24) * iVar24 | (uint)(iVar38 >= iVar24) * iVar38;
                uVar39 = (uint)(iVar25 < iVar31) * iVar31 | (uint)(iVar25 >= iVar31) * iVar25;
                uVar42 = (uint)(iVar35 < iVar34) * iVar34 | (uint)(iVar35 >= iVar34) * iVar35;
                uVar43 = (uint)(iVar32 < iVar36) * iVar36 | (uint)(iVar32 >= iVar36) * iVar32;
                piVar1 = (int *)((long)*ptr + sVar17);
                iVar24 = *piVar1;
                iVar31 = piVar1[1];
                iVar34 = piVar1[2];
                iVar36 = piVar1[3];
                uVar56 = (iVar24 < (int)uVar54) * uVar54 | (uint)(iVar24 >= (int)uVar54) * iVar24;
                uVar52 = (iVar31 < (int)uVar39) * uVar39 | (uint)(iVar31 >= (int)uVar39) * iVar31;
                uVar44 = (iVar34 < (int)uVar42) * uVar42 | (uint)(iVar34 >= (int)uVar42) * iVar34;
                uVar50 = (iVar36 < (int)uVar43) * uVar43 | (uint)(iVar36 >= (int)uVar43) * iVar36;
                iVar24 = (-1 < (int)uVar56) * uVar56;
                uVar52 = (-1 < (int)uVar52) * uVar52;
                uVar44 = (-1 < (int)uVar44) * uVar44;
                uVar50 = (-1 < (int)uVar50) * uVar50;
                piVar1 = (int *)((long)*b_00 + sVar17);
                *piVar1 = iVar24;
                piVar1[1] = uVar52;
                piVar1[2] = uVar44;
                piVar1[3] = uVar50;
                uVar61 = (uint)(iVar24 < (int)uVar61) * iVar24 | (iVar24 >= (int)uVar61) * uVar61;
                uVar62 = ((int)uVar52 < (int)uVar62) * uVar52 |
                         ((int)uVar52 >= (int)uVar62) * uVar62;
                uVar63 = ((int)uVar44 < (int)uVar63) * uVar44 |
                         ((int)uVar44 >= (int)uVar63) * uVar63;
                uVar64 = ((int)uVar50 < (int)uVar64) * uVar50 |
                         ((int)uVar50 >= (int)uVar64) * uVar64;
                piVar1 = ((ppVar10->field_4).rowcols)->score_row;
                *(int *)((long)piVar1 + lVar15) = iVar24;
                *(uint *)((long)piVar1 + lVar21 * 4 + lVar15) = uVar52;
                *(uint *)((long)piVar1 + lVar21 * 8 + lVar15) = uVar44;
                *(uint *)((long)piVar1 + lVar21 * 0xc + lVar15) = uVar50;
                uVar13 = (uint)((int)uVar13 < iVar24) * iVar24 | ((int)uVar13 >= iVar24) * uVar13;
                uVar58 = ((int)uVar58 < (int)uVar52) * uVar52 |
                         ((int)uVar58 >= (int)uVar52) * uVar58;
                uVar59 = ((int)uVar59 < (int)uVar44) * uVar44 |
                         ((int)uVar59 >= (int)uVar44) * uVar59;
                uVar60 = ((int)uVar60 < (int)uVar50) * uVar50 |
                         ((int)uVar60 >= (int)uVar50) * uVar60;
                uVar65 = (uint)((int)uVar65 < iVar24) * iVar24 | ((int)uVar65 >= iVar24) * uVar65;
                uVar66 = ((int)uVar66 < (int)uVar52) * uVar52 |
                         ((int)uVar66 >= (int)uVar52) * uVar66;
                uVar67 = ((int)uVar67 < (int)uVar44) * uVar44 |
                         ((int)uVar67 >= (int)uVar44) * uVar67;
                uVar68 = ((int)uVar68 < (int)uVar50) * uVar50 |
                         ((int)uVar68 >= (int)uVar50) * uVar68;
                lVar15 = lVar15 + uVar11 * 4;
              }
              auVar29._0_4_ = -(uint)((int)uVar26 < (int)uVar65);
              auVar29._4_4_ = -(uint)((int)uVar33 < (int)uVar66);
              auVar29._8_4_ = -(uint)((int)uVar69 < (int)uVar67);
              auVar29._12_4_ = -(uint)((int)uVar70 < (int)uVar68);
              iVar24 = movmskps((int)lVar15,auVar29);
              if (iVar24 != 0) {
                uVar26 = ((int)uVar67 < (int)uVar65) * uVar65 |
                         ((int)uVar67 >= (int)uVar65) * uVar67;
                uVar33 = ((int)uVar68 < (int)uVar66) * uVar66 |
                         ((int)uVar68 >= (int)uVar66) * uVar68;
                uVar26 = ((int)uVar33 < (int)uVar26) * uVar26 |
                         ((int)uVar33 >= (int)uVar26) * uVar33;
                memcpy(ptr_00,b_00,__n);
                local_14c = (int)uVar19;
                uVar33 = uVar26;
                uVar69 = uVar26;
                uVar70 = uVar26;
                local_150 = uVar26;
              }
              local_148 = local_148 + 4;
            }
            uVar12 = (uVar18 & 0x1fffffff) << 2;
            uVar19 = 0;
            while( true ) {
              iVar24 = (int)uVar20;
              if (uVar12 == (uint)uVar19) break;
              if ((*(uint *)((long)*ptr_00 + uVar19 * 4) == local_150) &&
                 (uVar26 = ((uint)uVar19 & 3) * uVar18 + ((uint)(uVar19 >> 2) & 0x3fffffff),
                 (int)uVar26 < iVar24)) {
                uVar20 = (ulong)uVar26;
              }
              uVar19 = uVar19 + 1;
            }
            auVar30._0_4_ = -(uint)((int)uVar61 < (int)uVar22);
            auVar30._4_4_ = -(uint)((int)uVar62 < (int)uVar22);
            auVar30._8_4_ = -(uint)((int)uVar63 < (int)uVar22);
            auVar30._12_4_ = -(uint)((int)uVar64 < (int)uVar22);
            auVar57._0_4_ = -(uint)((int)uVar9 < (int)uVar13);
            auVar57._4_4_ = -(uint)((int)uVar9 < (int)uVar58);
            auVar57._8_4_ = -(uint)((int)uVar9 < (int)uVar59);
            auVar57._12_4_ = -(uint)((int)uVar9 < (int)uVar60);
            iVar31 = movmskps(uVar12,auVar57 | auVar30);
            if (iVar31 != 0) {
              *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
              local_150 = 0;
              local_14c = 0;
              iVar24 = 0;
            }
            ppVar10->score = local_150;
            ppVar10->end_query = iVar24;
            ppVar10->end_ref = local_14c;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(b_00);
            parasail_free(ptr);
            parasail_free(b);
            return ppVar10;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar16 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_scan_profile_sse41_128_32",pcVar16);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32(vHt, vF);
        vH = _mm_max_epi32(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32(vHt, vF);
            vH = _mm_max_epi32(vH, vZero);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32(vH, vMaxH);
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int32_t *t = (int32_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}